

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_celsius.cc
# Opt level: O0

void __thiscall
hwtest::pgraph::MthdCelsiusAlphaFuncFunc::emulate_mthd(MthdCelsiusAlphaFuncFunc *this)

{
  uint local_14;
  uint32_t err;
  MthdCelsiusAlphaFuncFunc *this_local;
  
  pgraph_celsius_pre_icmd(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp);
  local_14 = 0;
  if (((this->super_SingleMthdTest).super_MthdTest.val < 0x200) ||
     (0x207 < (this->super_SingleMthdTest).super_MthdTest.val)) {
    local_14 = 1;
  }
  if ((long)((ulong)(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_config_c
            << 0x37) < 0) {
    local_14 = local_14 | 4;
  }
  if (local_14 == 0) {
    if (-1 < (long)((ulong)(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.nsource
                   << 0x3e)) {
      (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_config_a =
           (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_config_a &
           0xfffff0ff | ((this->super_SingleMthdTest).super_MthdTest.val & 0xf) << 8;
      pgraph_celsius_icmd(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp,0x1c,
                          (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.
                          bundle_config_a,true);
    }
  }
  else {
    MthdTest::warn((MthdTest *)this,local_14);
  }
  return;
}

Assistant:

void emulate_mthd() override {
		pgraph_celsius_pre_icmd(&exp);
		uint32_t err = 0;
		if (val >= 0x200 && val < 0x208) {
		} else {
			err |= 1;
		}
		if (extr(exp.celsius_config_c, 8, 1))
			err |= 4;
		if (err) {
			warn(err);
		} else {
			if (!extr(exp.nsource, 1, 1)) {
				insrt(exp.bundle_config_a, 8, 4, val);
				pgraph_celsius_icmd(&exp, 0x1c, exp.bundle_config_a, true);
			}
		}
	}